

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool member)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  CompilerError *pCVar4;
  size_t sVar5;
  string *ts_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2_00;
  char (*in_R9) [2];
  char (*in_stack_fffffffffffffbd8) [2];
  undefined4 in_stack_fffffffffffffbe0;
  uint uVar6;
  undefined2 in_stack_fffffffffffffbe4;
  undefined1 in_stack_fffffffffffffbe6;
  undefined1 in_stack_fffffffffffffbe7;
  byte local_334;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8;
  uint local_2b4;
  undefined1 local_2b0 [4];
  uint32_t i;
  string sizes;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  SPIRVariable *local_208;
  SPIRVariable *var_2;
  SPIRVariable *local_1f8;
  SPIRVariable *var_1;
  char *local_1e8;
  string local_1e0 [32];
  string local_1c0 [38];
  allocator local_19a;
  allocator local_199;
  string local_198 [32];
  string local_178 [32];
  string local_158;
  byte local_131;
  spirv_cross local_130 [7];
  bool old_is_using_builtin_array;
  string local_110;
  undefined4 local_ec;
  string local_e8 [32];
  string local_c8;
  char *local_a8;
  char *wrapper_type;
  uint32_t local_98;
  bool buffer_desc;
  SPIRVariable *pSStack_90;
  bool ssbo;
  SPIRVariable *var;
  SPIRType *p_parent_type;
  string type_address_space;
  char *restrict_kw;
  undefined1 local_48 [8];
  string type_name;
  bool member_local;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  string *res;
  
  ts_2 = __return_storage_ptr__;
  type_name.field_2._M_local_buf[0xb] = member;
  type_name.field_2._12_4_ = id;
  ::std::__cxx11::string::string((string *)local_48);
  bVar1 = Compiler::is_pointer((Compiler *)this,type);
  if ((bVar1) || (bVar1 = Compiler::type_is_array_of_pointers((Compiler *)this,type), bVar1)) {
    if (type->pointer_depth == 0) {
      __assert_fail("type.pointer_depth > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                    ,0x3e11,
                    "string spirv_cross::CompilerMSL::type_to_glsl(const SPIRType &, uint32_t, bool)"
                   );
    }
    ts_2_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    get_type_address_space_abi_cxx11_
              ((string *)&p_parent_type,this,type,type_name.field_2._12_4_,false);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
    var = (SPIRVariable *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    if (((type_name.field_2._M_local_buf[0xb] & 1U) == 0) || (type_name.field_2._12_4_ == 0)) {
LAB_0037b70a:
      bVar1 = Compiler::is_pointer((Compiler *)this,type);
      if ((bVar1) && (bVar1 = Compiler::is_pointer((Compiler *)this,(SPIRType *)var), bVar1)) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_130,this,var,(ulong)(uint)type_name.field_2._12_4_);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_110,local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x57fa85,
                   (char (*) [2])&p_parent_type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x57fa85,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)local_48,(string *)&local_110);
        ::std::__cxx11::string::~string((string *)&local_110);
        ::std::__cxx11::string::~string((string *)local_130);
      }
      else {
        while (bVar1 = Compiler::is_pointer((Compiler *)this,(SPIRType *)var), bVar1) {
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)((long)&var[1].dependees.buffer_capacity + 4));
          var = (SPIRVariable *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
        }
        local_131 = this->is_using_builtin_array & 1;
        bVar1 = Compiler::is_physical_pointer((Compiler *)this,type);
        if (bVar1) {
          this->is_using_builtin_array = false;
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_178,this,var,(ulong)(uint)type_name.field_2._12_4_);
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                  (&local_158,(spirv_cross *)&p_parent_type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x57fa85,
                   (char (*) [2])local_178,ts_2_00);
        ::std::__cxx11::string::operator=((string *)local_48,(string *)&local_158);
        ::std::__cxx11::string::~string((string *)&local_158);
        ::std::__cxx11::string::~string(local_178);
        this->is_using_builtin_array = (bool)(local_131 & 1);
      }
      if (2 < type->basetype - Image) {
        ::std::__cxx11::string::operator+=((string *)local_48,"*");
        type_address_space.field_2._8_8_ = to_restrict(this,type_name.field_2._12_4_,false);
        if (*(char *)type_address_space.field_2._8_8_ != '\0') {
          ::std::__cxx11::string::operator+=((string *)local_48," ");
          ::std::__cxx11::string::operator+=
                    ((string *)local_48,(char *)type_address_space.field_2._8_8_);
        }
      }
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
    }
    else {
      pSStack_90 = Compiler::get<spirv_cross::SPIRVariable>
                             ((Compiler *)this,type_name.field_2._12_4_);
      bVar1 = is_var_runtime_size_array(this,pSStack_90);
      if ((!bVar1) || (bVar1 = Compiler::is_runtime_size_array((SPIRType *)var), !bVar1))
      goto LAB_0037b70a;
      local_98 = (var->super_IVariant).self.id;
      buffer_desc = Compiler::has_decoration((Compiler *)this,(ID)local_98,BufferBlock);
      if ((pSStack_90->storage == StorageBuffer) || (local_334 = 0, buffer_desc)) {
        local_334 = (this->msl_options).runtime_array_rich_descriptor;
      }
      wrapper_type._7_1_ = local_334 & 1;
      local_a8 = "spvDescriptor";
      if (wrapper_type._7_1_ != 0) {
        local_a8 = "spvBufferDescriptor";
      }
      add_spv_func_and_recompile(this,SPVFuncImplVariableDescriptorArray);
      add_spv_func_and_recompile(this,(wrapper_type._7_1_ & 1) + SPVFuncImplVariableDescriptor);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_e8,this,var,(ulong)(uint)type_name.field_2._12_4_);
      join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4]>
                (&local_c8,(spirv_cross *)&local_a8,(char **)0x569209,(char (*) [2])&p_parent_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x57fa85,
                 (char (*) [2])local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" *>",
                 (char (*) [4])
                 CONCAT17(in_stack_fffffffffffffbe7,
                          CONCAT16(in_stack_fffffffffffffbe6,
                                   CONCAT24(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0))));
      ::std::__cxx11::string::operator=((string *)local_48,(string *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_c8);
      ::std::__cxx11::string::~string(local_e8);
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
    }
    local_ec = 1;
    ::std::__cxx11::string::~string((string *)&p_parent_type);
    goto LAB_0037c6e7;
  }
  switch(type->basetype) {
  case Void:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"void",&local_199);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_199);
    local_ec = 1;
    goto LAB_0037c6e7;
  case Boolean:
    local_1f8 = Compiler::maybe_get_backing_variable((Compiler *)this,type_name.field_2._12_4_);
    if ((local_1f8 != (SPIRVariable *)0x0) &&
       (uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_1f8->basevariable),
       uVar2 != 0)) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_1f8->basevariable);
      local_1f8 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
    }
    if ((((local_1f8 == (SPIRVariable *)0x0) || (local_1f8->storage != StorageClassWorkgroup)) &&
        (type->storage != StorageClassWorkgroup)) &&
       ((type_name.field_2._M_local_buf[0xb] & 1U) == 0)) {
      ::std::__cxx11::string::operator=((string *)local_48,"bool");
    }
    else {
      ::std::__cxx11::string::operator=((string *)local_48,"short");
    }
    break;
  case SByte:
  case Char:
    ::std::__cxx11::string::operator=((string *)local_48,"char");
    break;
  case UByte:
    ::std::__cxx11::string::operator=((string *)local_48,"uchar");
    break;
  case Short:
    ::std::__cxx11::string::operator=((string *)local_48,"short");
    break;
  case UShort:
    ::std::__cxx11::string::operator=((string *)local_48,"ushort");
    break;
  case Int:
    ::std::__cxx11::string::operator=((string *)local_48,"int");
    break;
  case UInt:
    ::std::__cxx11::string::operator=((string *)local_48,"uint");
    break;
  case Int64:
    bVar1 = Options::supports_msl_version(&this->msl_options,2,2,0);
    if (!bVar1) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"64-bit integers are only supported in MSL 2.2 and above.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::operator=((string *)local_48,"long");
    break;
  case UInt64:
    bVar1 = Options::supports_msl_version(&this->msl_options,2,2,0);
    if (!bVar1) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"64-bit integers are only supported in MSL 2.2 and above.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::operator=((string *)local_48,"ulong");
    break;
  case AtomicCounter:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"atomic_uint",&local_19a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19a);
    local_ec = 1;
    goto LAB_0037c6e7;
  case Half:
    ::std::__cxx11::string::operator=((string *)local_48,"half");
    break;
  case Float:
    ::std::__cxx11::string::operator=((string *)local_48,"float");
    break;
  case Double:
    ::std::__cxx11::string::operator=((string *)local_48,"double");
    break;
  case Struct:
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_198,this,(ulong)uVar2);
    ::std::__cxx11::string::operator=((string *)local_48,local_198);
    ::std::__cxx11::string::~string(local_198);
    break;
  case Image:
  case SampledImage:
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
              (__return_storage_ptr__,this,type,(ulong)(uint)type_name.field_2._12_4_,
               (ulong)((byte)type_name.field_2._M_local_buf[0xb] & 1));
    local_ec = 1;
    goto LAB_0037c6e7;
  case Sampler:
    sampler_type_abi_cxx11_
              (__return_storage_ptr__,this,type,type_name.field_2._12_4_,
               (bool)(type_name.field_2._M_local_buf[0xb] & 1));
    local_ec = 1;
    goto LAB_0037c6e7;
  case AccelerationStructure:
    bVar1 = Options::supports_msl_version(&this->msl_options,2,4,0);
    if (bVar1) {
      ::std::__cxx11::string::operator=
                ((string *)local_48,"raytracing::acceleration_structure<raytracing::instancing>");
    }
    else {
      bVar1 = Options::supports_msl_version(&this->msl_options,2,3,0);
      if (!bVar1) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar4,"Acceleration Structure Type is supported in MSL 2.3 and above.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::__cxx11::string::operator=
                ((string *)local_48,"raytracing::instance_acceleration_structure");
    }
    break;
  case RayQuery:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "raytracing::intersection_query<raytracing::instancing, raytracing::triangle_data>",
               (allocator *)((long)&var_2 + 7));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&var_2 + 7));
    local_ec = 1;
    goto LAB_0037c6e7;
  case ControlPointArray:
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
    pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (local_1c0,this,pSVar3,(ulong)(uint)type_name.field_2._12_4_);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)"patch_control_point<",(char (*) [21])local_1c0
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,
               (char (*) [2])ts_2);
    ::std::__cxx11::string::~string(local_1c0);
    local_ec = 1;
    goto LAB_0037c6e7;
  case Interpolant:
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
    pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (local_1e0,this,pSVar3,(ulong)(uint)type_name.field_2._12_4_);
    var_1._4_4_ = (type->super_IVariant).self.id;
    bVar1 = Compiler::has_decoration((Compiler *)this,var_1._4_4_,DecorationNoPerspective);
    local_1e8 = "centroid_perspective";
    if (bVar1) {
      local_1e8 = "centroid_no_perspective";
    }
    local_1e8 = local_1e8 + 9;
    join<char_const(&)[13],std::__cxx11::string,char_const(&)[18],char_const*,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)"interpolant<",(char (*) [13])local_1e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ", interpolation::",(char (*) [18])&local_1e8,(char **)0x5a981b,
               in_stack_fffffffffffffbd8);
    ::std::__cxx11::string::~string(local_1e0);
    local_ec = 1;
    goto LAB_0037c6e7;
  case MeshGridProperties:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"mesh_grid_properties",
               (allocator *)((long)&var_2 + 6));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&var_2 + 6));
    local_ec = 1;
    goto LAB_0037c6e7;
  default:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"unknown_type",(allocator *)((long)&var_2 + 5));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&var_2 + 5));
    local_ec = 1;
    goto LAB_0037c6e7;
  }
  if (1 < type->columns) {
    local_208 = Compiler::maybe_get_backing_variable((Compiler *)this,type_name.field_2._12_4_);
    if ((local_208 != (SPIRVariable *)0x0) &&
       (uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_208->basevariable),
       uVar2 != 0)) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_208->basevariable);
      local_208 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
    }
    if ((((local_208 != (SPIRVariable *)0x0) && (local_208->storage == StorageClassWorkgroup)) ||
        (type->storage == StorageClassWorkgroup)) &&
       (bVar1 = Options::supports_msl_version(&this->msl_options,3,0,0), !bVar1)) {
      add_spv_func_and_recompile(this,SPVFuncImplStorageMatrix);
      ::std::operator+(&local_228,"spvStorage_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
      ::std::__cxx11::string::operator=((string *)local_48,(string *)&local_228);
      ::std::__cxx11::string::~string((string *)&local_228);
    }
    ::std::__cxx11::to_string(&local_268,type->columns);
    ::std::operator+(&local_248,&local_268,"x");
    ::std::__cxx11::string::operator+=((string *)local_48,(string *)&local_248);
    ::std::__cxx11::string::~string((string *)&local_248);
    ::std::__cxx11::string::~string((string *)&local_268);
  }
  if (1 < type->vecsize) {
    ::std::__cxx11::to_string(&local_288,type->vecsize);
    ::std::__cxx11::string::operator+=((string *)local_48,(string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_288);
  }
  bVar1 = VectorView<unsigned_int>::empty(&(type->array).super_VectorView<unsigned_int>);
  if ((bVar1) || (bVar1 = using_builtin_array(this), bVar1)) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
    local_ec = 1;
  }
  else {
    add_spv_func_and_recompile(this,SPVFuncImplUnsafeArray);
    sizes.field_2._M_local_buf[0xf] = '\0';
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
    ::std::__cxx11::string::string((string *)local_2b0);
    local_2b4 = 0;
    while (uVar6 = local_2b4,
          sVar5 = VectorView<unsigned_int>::size(&(type->array).super_VectorView<unsigned_int>),
          uVar6 < (uint)sVar5) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"spvUnsafeArray<");
      ::std::__cxx11::string::operator+=((string *)local_2b0,", ");
      CompilerGLSL::to_array_size_abi_cxx11_(&local_2d8,&this->super_CompilerGLSL,type,local_2b4);
      ::std::__cxx11::string::operator+=((string *)local_2b0,(string *)&local_2d8);
      ::std::__cxx11::string::~string((string *)&local_2d8);
      ::std::__cxx11::string::operator+=((string *)local_2b0,">");
      local_2b4 = local_2b4 + 1;
    }
    ::std::operator+(&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0)
    ;
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2f8);
    ::std::__cxx11::string::~string((string *)&local_2f8);
    sizes.field_2._M_local_buf[0xf] = '\x01';
    local_ec = 1;
    ::std::__cxx11::string::~string((string *)local_2b0);
    if ((sizes.field_2._M_local_buf[0xf] & 1U) == 0) {
      ::std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
LAB_0037c6e7:
  ::std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::type_to_glsl(const SPIRType &type, uint32_t id, bool member)
{
	string type_name;

	// Pointer?
	if (is_pointer(type) || type_is_array_of_pointers(type))
	{
		assert(type.pointer_depth > 0);

		const char *restrict_kw;

		auto type_address_space = get_type_address_space(type, id);
		const auto *p_parent_type = &get<SPIRType>(type.parent_type);

		// If we're wrapping buffer descriptors in a spvDescriptorArray, we'll have to handle it as a special case.
		if (member && id)
		{
			auto &var = get<SPIRVariable>(id);
			if (is_var_runtime_size_array(var) && is_runtime_size_array(*p_parent_type))
			{
				const bool ssbo = has_decoration(p_parent_type->self, DecorationBufferBlock);
				bool buffer_desc =
						(var.storage == StorageClassStorageBuffer || ssbo) &&
						msl_options.runtime_array_rich_descriptor;

				const char *wrapper_type = buffer_desc ? "spvBufferDescriptor" : "spvDescriptor";
				add_spv_func_and_recompile(SPVFuncImplVariableDescriptorArray);
				add_spv_func_and_recompile(buffer_desc ? SPVFuncImplVariableSizedDescriptor : SPVFuncImplVariableDescriptor);

				type_name = join(wrapper_type, "<", type_address_space, " ", type_to_glsl(*p_parent_type, id), " *>");
				return type_name;
			}
		}

		// Work around C pointer qualifier rules. If glsl_type is a pointer type as well
		// we'll need to emit the address space to the right.
		// We could always go this route, but it makes the code unnatural.
		// Prefer emitting thread T *foo over T thread* foo since it's more readable,
		// but we'll have to emit thread T * thread * T constant bar; for example.
		if (is_pointer(type) && is_pointer(*p_parent_type))
			type_name = join(type_to_glsl(*p_parent_type, id), " ", type_address_space, " ");
		else
		{
			// Since this is not a pointer-to-pointer, ensure we've dug down to the base type.
			// Some situations chain pointers even though they are not formally pointers-of-pointers.
			while (is_pointer(*p_parent_type))
				p_parent_type = &get<SPIRType>(p_parent_type->parent_type);

			// If we're emitting BDA, just use the templated type.
			// Emitting builtin arrays need a lot of cooperation with other code to ensure
			// the C-style nesting works right.
			// FIXME: This is somewhat of a hack.
			bool old_is_using_builtin_array = is_using_builtin_array;
			if (is_physical_pointer(type))
				is_using_builtin_array = false;

			type_name = join(type_address_space, " ", type_to_glsl(*p_parent_type, id));

			is_using_builtin_array = old_is_using_builtin_array;
		}

		switch (type.basetype)
		{
		case SPIRType::Image:
		case SPIRType::SampledImage:
		case SPIRType::Sampler:
			// These are handles.
			break;
		default:
			// Anything else can be a raw pointer.
			type_name += "*";
			restrict_kw = to_restrict(id, false);
			if (*restrict_kw)
			{
				type_name += " ";
				type_name += restrict_kw;
			}
			break;
		}
		return type_name;
	}

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		// Allow Metal to use the array<T> template to make arrays a value type
		type_name = to_name(type.self);
		break;

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_glsl(type, id, member);

	case SPIRType::Sampler:
		return sampler_type(type, id, member);

	case SPIRType::Void:
		return "void";

	case SPIRType::AtomicCounter:
		return "atomic_uint";

	case SPIRType::ControlPointArray:
		return join("patch_control_point<", type_to_glsl(get<SPIRType>(type.parent_type), id), ">");

	case SPIRType::Interpolant:
		return join("interpolant<", type_to_glsl(get<SPIRType>(type.parent_type), id), ", interpolation::",
		            has_decoration(type.self, DecorationNoPerspective) ? "no_perspective" : "perspective", ">");

	// Scalars
	case SPIRType::Boolean:
	{
		auto *var = maybe_get_backing_variable(id);
		if (var && var->basevariable)
			var = &get<SPIRVariable>(var->basevariable);

		// Need to special-case threadgroup booleans. They are supposed to be logical
		// storage, but MSL compilers will sometimes crash if you use threadgroup bool.
		// Workaround this by using 16-bit types instead and fixup on load-store to this data.
		if ((var && var->storage == StorageClassWorkgroup) || type.storage == StorageClassWorkgroup || member)
			type_name = "short";
		else
			type_name = "bool";
		break;
	}

	case SPIRType::Char:
	case SPIRType::SByte:
		type_name = "char";
		break;
	case SPIRType::UByte:
		type_name = "uchar";
		break;
	case SPIRType::Short:
		type_name = "short";
		break;
	case SPIRType::UShort:
		type_name = "ushort";
		break;
	case SPIRType::Int:
		type_name = "int";
		break;
	case SPIRType::UInt:
		type_name = "uint";
		break;
	case SPIRType::Int64:
		if (!msl_options.supports_msl_version(2, 2))
			SPIRV_CROSS_THROW("64-bit integers are only supported in MSL 2.2 and above.");
		type_name = "long";
		break;
	case SPIRType::UInt64:
		if (!msl_options.supports_msl_version(2, 2))
			SPIRV_CROSS_THROW("64-bit integers are only supported in MSL 2.2 and above.");
		type_name = "ulong";
		break;
	case SPIRType::Half:
		type_name = "half";
		break;
	case SPIRType::Float:
		type_name = "float";
		break;
	case SPIRType::Double:
		type_name = "double"; // Currently unsupported
		break;
	case SPIRType::AccelerationStructure:
		if (msl_options.supports_msl_version(2, 4))
			type_name = "raytracing::acceleration_structure<raytracing::instancing>";
		else if (msl_options.supports_msl_version(2, 3))
			type_name = "raytracing::instance_acceleration_structure";
		else
			SPIRV_CROSS_THROW("Acceleration Structure Type is supported in MSL 2.3 and above.");
		break;
	case SPIRType::RayQuery:
		return "raytracing::intersection_query<raytracing::instancing, raytracing::triangle_data>";
	case SPIRType::MeshGridProperties:
		return "mesh_grid_properties";

	default:
		return "unknown_type";
	}

	// Matrix?
	if (type.columns > 1)
	{
		auto *var = maybe_get_backing_variable(id);
		if (var && var->basevariable)
			var = &get<SPIRVariable>(var->basevariable);

		// Need to special-case threadgroup matrices. Due to an oversight, Metal's
		// matrix struct prior to Metal 3 lacks constructors in the threadgroup AS,
		// preventing us from default-constructing or initializing matrices in threadgroup storage.
		// Work around this by using our own type as storage.
		if (((var && var->storage == StorageClassWorkgroup) || type.storage == StorageClassWorkgroup) &&
		    !msl_options.supports_msl_version(3, 0))
		{
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			type_name = "spvStorage_" + type_name;
		}

		type_name += to_string(type.columns) + "x";
	}

	// Vector or Matrix?
	if (type.vecsize > 1)
		type_name += to_string(type.vecsize);

	if (type.array.empty() || using_builtin_array())
	{
		return type_name;
	}
	else
	{
		// Allow Metal to use the array<T> template to make arrays a value type
		add_spv_func_and_recompile(SPVFuncImplUnsafeArray);
		string res;
		string sizes;

		for (uint32_t i = 0; i < uint32_t(type.array.size()); i++)
		{
			res += "spvUnsafeArray<";
			sizes += ", ";
			sizes += to_array_size(type, i);
			sizes += ">";
		}

		res += type_name + sizes;
		return res;
	}
}